

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

void __thiscall IntElemBoundsImp<0,_0,_0>::wakeup(IntElemBoundsImp<0,_0,_0> *this,int i,int c)

{
  uint uVar1;
  int iVar2;
  IntVar *pIVar3;
  int iVar4;
  int iVar5;
  TrailElem local_30;
  
  uVar1 = (this->a).sz;
  if (((c & 8U) == 0 || uVar1 + 2 != i) ||
     ((short)(char)((int)sat.assigns.data[(uint)(this->b).v] +
                    (((int)sat.assigns.data[(uint)(this->b).v] + 1U & 0xffff) >> 0xf) + 1 >> 1) !=
      (ushort)(this->b).s)) {
    local_30.pt = (int *)&this->is_fixed;
    if (uVar1 + 1 == i && (c & 8U) != 0) {
      local_30.x = (int)(this->is_fixed).v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->is_fixed).v = '\x01';
      iVar2 = (((this->x).var)->min).v;
      local_30.pt = &(this->fixed_index).v;
      local_30.x = (this->fixed_index).v;
      local_30.sz = 4;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->fixed_index).v = iVar2;
      this->no_min_support = false;
      this->no_max_support = false;
    }
    else if (((Tchar *)local_30.pt)->v == '\0') {
      if (i < (int)uVar1) {
        if (((this->min_support).v == i) &&
           ((((this->y).var)->min).v < (((this->a).data[(uint)i].var)->min).v)) {
          this->no_min_support = true;
        }
        if (((this->max_support).v == i) &&
           ((((this->a).data[(uint)i].var)->max).v < (((this->y).var)->max).v)) {
          this->no_max_support = true;
        }
      }
      else if (uVar1 + 1 == i) {
        iVar2 = (this->min_support).v;
        pIVar3 = (this->x).var;
        iVar5 = (pIVar3->min).v;
        iVar4 = (pIVar3->max).v;
        if ((iVar4 < iVar2 || iVar2 < iVar5) ||
           ((pIVar3->vals != (Tchar *)0x0 && (pIVar3->vals[iVar2].v == '\0')))) {
          this->no_min_support = true;
          Propagator::pushInQueue(&this->super_Propagator);
          pIVar3 = (this->x).var;
          iVar5 = (pIVar3->min).v;
          iVar4 = (pIVar3->max).v;
        }
        iVar2 = (this->max_support).v;
        if ((iVar5 <= iVar2) && (iVar2 <= iVar4)) {
          if (pIVar3->vals == (Tchar *)0x0) {
            return;
          }
          if (pIVar3->vals[iVar2].v != '\0') {
            return;
          }
        }
        this->no_max_support = true;
        Propagator::pushInQueue(&this->super_Propagator);
        return;
      }
    }
    else if ((uVar1 != i) && ((this->fixed_index).v != i)) {
      return;
    }
    if ((this->super_Propagator).in_queue == false) {
      (this->super_Propagator).in_queue = true;
      local_30.pt = (int *)this;
      vec<Propagator_*>::push
                (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                 (Propagator **)&local_30);
    }
  }
  return;
}

Assistant:

void wakeup(int i, int c) override {
		if (i == static_cast<int>(a.size()) + 2 && ((c & EVENT_F) != 0)) {
			if (b.getVal() == 0) {
				return;
			}
		}
		if (i == static_cast<int>(a.size()) + 1 && ((c & EVENT_F) != 0)) {
			is_fixed = 1;
			fixed_index = static_cast<int>(x.getVal());
			no_min_support = no_max_support = false;
			pushInQueue();
		} else if (is_fixed != 0) {
			if (i == static_cast<int>(a.size()) || i == fixed_index) {
				pushInQueue();
			}
		} else {
			if (i < static_cast<int>(a.size())) {
				if (i == min_support && a[i].getMin() > y.getMin()) {
					no_min_support = true;
				}
				if (i == max_support && a[i].getMax() < y.getMax()) {
					no_max_support = true;
				}
				pushInQueue();
			} else if (i == static_cast<int>(a.size() + 1)) {
				if (!x.indomain(min_support)) {
					no_min_support = true;
					pushInQueue();
				}
				if (!x.indomain(max_support)) {
					no_max_support = true;
					pushInQueue();
				}
			} else {
				pushInQueue();
			}
		}
	}